

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVector<llvm::DILineInfo,_4U>::~SmallVector(SmallVector<llvm::DILineInfo,_4U> *this)

{
  DILineInfo *S;
  
  S = (DILineInfo *)
      (this->super_SmallVectorImpl<llvm::DILineInfo>).
      super_SmallVectorTemplateBase<llvm::DILineInfo,_false>.
      super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>.super_SmallVectorBase.BeginX;
  SmallVectorTemplateBase<llvm::DILineInfo,_false>::destroy_range
            (S,S + (this->super_SmallVectorImpl<llvm::DILineInfo>).
                   super_SmallVectorTemplateBase<llvm::DILineInfo,_false>.
                   super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>.super_SmallVectorBase.
                   Size);
  SmallVectorImpl<llvm::DILineInfo>::~SmallVectorImpl
            (&this->super_SmallVectorImpl<llvm::DILineInfo>);
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }